

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cors.cpp
# Opt level: O3

ssize_t __thiscall Vault::Sys::Cors::read(Cors *this,int __fd,void *__buf,size_t __nbytes)

{
  Client *client;
  undefined4 in_register_00000034;
  Url local_38;
  
  client = *(Client **)CONCAT44(in_register_00000034,__fd);
  getUrl_abi_cxx11_(&local_38,(Cors *)CONCAT44(in_register_00000034,__fd));
  HttpConsumer::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this,client,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.value_._M_dataplus._M_p != &local_38.value_.field_2) {
    operator_delete(local_38.value_._M_dataplus._M_p,
                    local_38.value_.field_2._M_allocated_capacity + 1);
  }
  return (ssize_t)this;
}

Assistant:

std::optional<std::string> Vault::Sys::Cors::read(const Path &path) {
  return HttpConsumer::get(client_, getUrl());
}